

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O2

void __thiscall CPU::ROR_AB_X(CPU *this)

{
  uint16_t uVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte data;
  
  this->cycles = 7;
  uVar1 = GetWord(this);
  bVar2 = (char)uVar1 + this->X;
  this->cycles = this->cycles - 1;
  bVar3 = ReadByte(this,(ushort)bVar2);
  bVar4 = (this->field_6).ps << 7;
  this->cycles = this->cycles - 1;
  data = bVar4 | bVar3 >> 1;
  (this->field_6).ps = bVar4 | (data == 0) * '\x02' | (this->field_6).ps & 0x7c | bVar3 & 1;
  WriteByte(this,(ushort)bVar2,data);
  return;
}

Assistant:

void CPU::ROR_AB_X()
{
    cycles = 7;
    uint8_t addr = GetWord() + X;
    cycles--;
    uint8_t data = ReadByte(addr);
    uint8_t cr = C ? 0b10000000 : 0;
    C = (data & 0b00000001) > 0;
    data >>= 1;
    data |= cr;
    cycles--;
    Z = (data == 0);
    N = (data & 0b10000000) > 0;
    WriteByte(addr, data);
}